

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O2

Aig_Man_t * Ssw_SpeculativeReduction(Ssw_Man_t *p)

{
  char *__s;
  Aig_Man_t *p_00;
  size_t sVar1;
  char *__dest;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  Aig_Man_t *pAVar5;
  int iVar6;
  int iVar7;
  
  if (p->pFrames != (Aig_Man_t *)0x0) {
    __assert_fail("p->pFrames == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xd9,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
  }
  pAVar5 = p->pAig;
  if (0 < pAVar5->nRegs) {
    if (pAVar5->nRegs < pAVar5->nObjs[2]) {
      p->nConstrTotal = 0;
      p->nConstrReduced = 0;
      p_00 = Aig_ManStart(p->nFrames * pAVar5->vObjs->nSize);
      pAVar5 = p->pAig;
      __s = pAVar5->pName;
      iVar7 = 0;
      if (__s == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar1 = strlen(__s);
        __dest = (char *)malloc(sVar1 + 1);
        strcpy(__dest,__s);
      }
      p_00->pName = __dest;
      p->pNodeToFrames[(long)pAVar5->pConst1->Id * (long)p->nFrames] = p_00->pConst1;
      for (; pAVar5 = p->pAig, iVar7 < pAVar5->nTruePis; iVar7 = iVar7 + 1) {
        pvVar2 = Vec_PtrEntry(pAVar5->vCis,iVar7);
        pAVar3 = Aig_ObjCreateCi(p_00);
        p->pNodeToFrames[(long)*(int *)((long)pvVar2 + 0x24) * (long)p->nFrames] = pAVar3;
      }
      for (iVar7 = 0; iVar6 = pAVar5->nRegs, iVar7 < iVar6; iVar7 = iVar7 + 1) {
        pvVar2 = Vec_PtrEntry(pAVar5->vCis,pAVar5->nTruePis + iVar7);
        pAVar3 = Aig_ObjCreateCi(p_00);
        p->pNodeToFrames[(long)*(int *)((long)pvVar2 + 0x24) * (long)p->nFrames] = pAVar3;
        pAVar5 = p->pAig;
      }
      for (iVar7 = 0; iVar7 < iVar6; iVar7 = iVar7 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAVar5->vCis,pAVar5->nTruePis + iVar7);
        Ssw_FramesConstrainNode(p,p_00,p->pAig,pAVar3,0,0);
        pAVar5 = p->pAig;
        iVar6 = pAVar5->nRegs;
      }
      for (iVar7 = 0; iVar7 < pAVar5->vObjs->nSize; iVar7 = iVar7 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAVar5->vObjs,iVar7);
        if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
          pAVar4 = Ssw_ObjChild0Fra(p,pAVar3,0);
          p1 = Ssw_ObjChild1Fra(p,pAVar3,0);
          pAVar4 = Aig_And(p_00,pAVar4,p1);
          p->pNodeToFrames[(long)pAVar3->Id * (long)p->nFrames] = pAVar4;
          Ssw_FramesConstrainNode(p,p_00,p->pAig,pAVar3,0,0);
        }
        pAVar5 = p->pAig;
      }
      for (iVar7 = 0; iVar7 < pAVar5->nRegs; iVar7 = iVar7 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAVar5->vCos,pAVar5->nTruePos + iVar7);
        pAVar3 = Ssw_ObjChild0Fra(p,pAVar3,0);
        Aig_ObjCreateCo(p_00,pAVar3);
        pAVar5 = p->pAig;
      }
      Aig_ManCleanup(p_00);
      Aig_ManSetRegNum(p_00,p->pAig->nRegs);
      return p_00;
    }
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xdb,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
  }
  __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                ,0xda,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
}

Assistant:

Aig_Man_t * Ssw_SpeculativeReduction( Ssw_Man_t * p )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    assert( p->pFrames == NULL );
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    p->nConstrTotal = p->nConstrReduced = 0;

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFrames );
    pFrames->pName = Abc_UtilStrsav( p->pAig->pName );
    // map constants and PIs
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), 0, Aig_ManConst1(pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // create latches for the first frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // set the constraints on the latch outputs
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, 0, 0 );
    // add internal nodes of this frame
    Aig_ManForEachNode( p->pAig, pObj, i )
    {
        pObjNew = Aig_And( pFrames, Ssw_ObjChild0Fra(p, pObj, 0), Ssw_ObjChild1Fra(p, pObj, 0) );
        Ssw_ObjSetFrame( p, pObj, 0, pObjNew );
        Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, 0, 0 );
    }
    // add the POs for the latch outputs of the last frame
    Saig_ManForEachLi( p->pAig, pObj, i )
        Aig_ObjCreateCo( pFrames, Ssw_ObjChild0Fra(p, pObj,0) );
    // remove dangling nodes
    Aig_ManCleanup( pFrames );
    Aig_ManSetRegNum( pFrames, Aig_ManRegNum(p->pAig) );
//    Abc_Print( 1, "SpecRed: Total constraints = %d. Reduced constraints = %d.\n", 
//        p->nConstrTotal, p->nConstrReduced );
    return pFrames;
}